

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

Optimizer * __thiscall
spvtools::Optimizer::RegisterSizePasses(Optimizer *this,bool preserve_interface)

{
  Optimizer *pOVar1;
  PassToken local_120;
  PassToken local_118;
  PassToken local_110;
  PassToken local_108;
  PassToken local_100;
  PassToken local_f8;
  PassToken local_f0;
  PassToken local_e8;
  PassToken local_e0;
  PassToken local_d8;
  PassToken local_d0;
  PassToken local_c8;
  PassToken local_c0;
  PassToken local_b8;
  PassToken local_b0;
  PassToken local_a8;
  PassToken local_a0;
  PassToken local_98;
  PassToken local_90;
  PassToken local_88;
  PassToken local_80;
  PassToken local_78;
  PassToken local_70;
  PassToken local_68;
  PassToken local_60;
  PassToken local_58;
  PassToken local_50;
  PassToken local_48;
  PassToken local_40;
  PassToken local_38;
  PassToken local_30;
  PassToken local_28;
  PassToken local_20;
  byte local_11;
  Optimizer *pOStack_10;
  bool preserve_interface_local;
  Optimizer *this_local;
  
  local_11 = preserve_interface;
  pOStack_10 = this;
  CreateWrapOpKillPass();
  pOVar1 = RegisterPass(this,&local_20);
  CreateDeadBranchElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_28);
  CreateMergeReturnPass();
  pOVar1 = RegisterPass(pOVar1,&local_30);
  CreateInlineExhaustivePass();
  pOVar1 = RegisterPass(pOVar1,&local_38);
  CreateEliminateDeadFunctionsPass();
  pOVar1 = RegisterPass(pOVar1,&local_40);
  CreatePrivateToLocalPass();
  pOVar1 = RegisterPass(pOVar1,&local_48);
  CreateScalarReplacementPass((spvtools *)&local_50,0);
  pOVar1 = RegisterPass(pOVar1,&local_50);
  CreateLocalMultiStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_58);
  CreateCCPPass();
  pOVar1 = RegisterPass(pOVar1,&local_60);
  CreateLoopUnrollPass((spvtools *)&local_68,true,0);
  pOVar1 = RegisterPass(pOVar1,&local_68);
  CreateDeadBranchElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_70);
  CreateSimplificationPass();
  pOVar1 = RegisterPass(pOVar1,&local_78);
  CreateScalarReplacementPass((spvtools *)&local_80,0);
  pOVar1 = RegisterPass(pOVar1,&local_80);
  CreateLocalSingleStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_88);
  CreateIfConversionPass();
  pOVar1 = RegisterPass(pOVar1,&local_90);
  CreateSimplificationPass();
  pOVar1 = RegisterPass(pOVar1,&local_98);
  CreateAggressiveDCEPass((spvtools *)&local_a0,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_a0);
  CreateDeadBranchElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_a8);
  CreateBlockMergePass();
  pOVar1 = RegisterPass(pOVar1,&local_b0);
  CreateLocalAccessChainConvertPass();
  pOVar1 = RegisterPass(pOVar1,&local_b8);
  CreateLocalSingleBlockLoadStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_c0);
  CreateAggressiveDCEPass((spvtools *)&local_c8,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_c8);
  CreateCopyPropagateArraysPass();
  pOVar1 = RegisterPass(pOVar1,&local_d0);
  CreateVectorDCEPass();
  pOVar1 = RegisterPass(pOVar1,&local_d8);
  CreateDeadInsertElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_e0);
  CreateEliminateDeadMembersPass();
  pOVar1 = RegisterPass(pOVar1,&local_e8);
  CreateLocalSingleStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_f0);
  CreateBlockMergePass();
  pOVar1 = RegisterPass(pOVar1,&local_f8);
  CreateLocalMultiStoreElimPass();
  pOVar1 = RegisterPass(pOVar1,&local_100);
  CreateRedundancyEliminationPass();
  pOVar1 = RegisterPass(pOVar1,&local_108);
  CreateSimplificationPass();
  pOVar1 = RegisterPass(pOVar1,&local_110);
  CreateAggressiveDCEPass((spvtools *)&local_118,(bool)(local_11 & 1));
  pOVar1 = RegisterPass(pOVar1,&local_118);
  CreateCFGCleanupPass();
  pOVar1 = RegisterPass(pOVar1,&local_120);
  PassToken::~PassToken(&local_120);
  PassToken::~PassToken(&local_118);
  PassToken::~PassToken(&local_110);
  PassToken::~PassToken(&local_108);
  PassToken::~PassToken(&local_100);
  PassToken::~PassToken(&local_f8);
  PassToken::~PassToken(&local_f0);
  PassToken::~PassToken(&local_e8);
  PassToken::~PassToken(&local_e0);
  PassToken::~PassToken(&local_d8);
  PassToken::~PassToken(&local_d0);
  PassToken::~PassToken(&local_c8);
  PassToken::~PassToken(&local_c0);
  PassToken::~PassToken(&local_b8);
  PassToken::~PassToken(&local_b0);
  PassToken::~PassToken(&local_a8);
  PassToken::~PassToken(&local_a0);
  PassToken::~PassToken(&local_98);
  PassToken::~PassToken(&local_90);
  PassToken::~PassToken(&local_88);
  PassToken::~PassToken(&local_80);
  PassToken::~PassToken(&local_78);
  PassToken::~PassToken(&local_70);
  PassToken::~PassToken(&local_68);
  PassToken::~PassToken(&local_60);
  PassToken::~PassToken(&local_58);
  PassToken::~PassToken(&local_50);
  PassToken::~PassToken(&local_48);
  PassToken::~PassToken(&local_40);
  PassToken::~PassToken(&local_38);
  PassToken::~PassToken(&local_30);
  PassToken::~PassToken(&local_28);
  PassToken::~PassToken(&local_20);
  return pOVar1;
}

Assistant:

Optimizer& Optimizer::RegisterSizePasses(bool preserve_interface) {
  return RegisterPass(CreateWrapOpKillPass())
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateMergeReturnPass())
      .RegisterPass(CreateInlineExhaustivePass())
      .RegisterPass(CreateEliminateDeadFunctionsPass())
      .RegisterPass(CreatePrivateToLocalPass())
      .RegisterPass(CreateScalarReplacementPass(0))
      .RegisterPass(CreateLocalMultiStoreElimPass())
      .RegisterPass(CreateCCPPass())
      .RegisterPass(CreateLoopUnrollPass(true))
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateSimplificationPass())
      .RegisterPass(CreateScalarReplacementPass(0))
      .RegisterPass(CreateLocalSingleStoreElimPass())
      .RegisterPass(CreateIfConversionPass())
      .RegisterPass(CreateSimplificationPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateDeadBranchElimPass())
      .RegisterPass(CreateBlockMergePass())
      .RegisterPass(CreateLocalAccessChainConvertPass())
      .RegisterPass(CreateLocalSingleBlockLoadStoreElimPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateCopyPropagateArraysPass())
      .RegisterPass(CreateVectorDCEPass())
      .RegisterPass(CreateDeadInsertElimPass())
      .RegisterPass(CreateEliminateDeadMembersPass())
      .RegisterPass(CreateLocalSingleStoreElimPass())
      .RegisterPass(CreateBlockMergePass())
      .RegisterPass(CreateLocalMultiStoreElimPass())
      .RegisterPass(CreateRedundancyEliminationPass())
      .RegisterPass(CreateSimplificationPass())
      .RegisterPass(CreateAggressiveDCEPass(preserve_interface))
      .RegisterPass(CreateCFGCleanupPass());
}